

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void zeroPage(MemPage *pPage,int flags)

{
  u8 *puVar1;
  byte bVar2;
  BtShared *pBVar3;
  u8 *puVar4;
  u16 uVar5;
  bool bVar6;
  
  pBVar3 = pPage->pBt;
  puVar4 = pPage->aData;
  bVar2 = pPage->hdrOffset;
  if ((pBVar3->btsFlags & 0xc) != 0) {
    memset(puVar4 + bVar2,0,(ulong)(pBVar3->usableSize - (uint)bVar2));
  }
  puVar4[bVar2] = (u8)flags;
  bVar6 = (flags & 8U) == 0;
  uVar5 = (ushort)bVar2 + (ushort)bVar6 * 4 + 8;
  puVar1 = puVar4 + (ulong)bVar2 + 1;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar4[(ulong)bVar2 + 7] = '\0';
  puVar4[(ulong)bVar2 + 5] = *(u8 *)((long)&pBVar3->usableSize + 1);
  puVar4[(ulong)bVar2 + 6] = (u8)pBVar3->usableSize;
  pPage->nFree = (short)pBVar3->usableSize - uVar5;
  decodeFlags(pPage,flags);
  pPage->cellOffset = uVar5;
  pPage->aDataEnd = puVar4 + pBVar3->usableSize;
  pPage->aCellIdx = puVar4 + (ulong)((uint)bVar2 + (uint)bVar6 * 4) + 8;
  pPage->aDataOfst = puVar4 + pPage->childPtrSize;
  pPage->nOverflow = '\0';
  pPage->maskPage = (short)pBVar3->pageSize - 1;
  pPage->nCell = 0;
  pPage->isInit = '\x01';
  return;
}

Assistant:

static void zeroPage(MemPage *pPage, int flags){
  unsigned char *data = pPage->aData;
  BtShared *pBt = pPage->pBt;
  u8 hdr = pPage->hdrOffset;
  u16 first;

  assert( sqlite3PagerPagenumber(pPage->pDbPage)==pPage->pgno );
  assert( sqlite3PagerGetExtra(pPage->pDbPage) == (void*)pPage );
  assert( sqlite3PagerGetData(pPage->pDbPage) == data );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pBt->btsFlags & BTS_FAST_SECURE ){
    memset(&data[hdr], 0, pBt->usableSize - hdr);
  }
  data[hdr] = (char)flags;
  first = hdr + ((flags&PTF_LEAF)==0 ? 12 : 8);
  memset(&data[hdr+1], 0, 4);
  data[hdr+7] = 0;
  put2byte(&data[hdr+5], pBt->usableSize);
  pPage->nFree = (u16)(pBt->usableSize - first);
  decodeFlags(pPage, flags);
  pPage->cellOffset = first;
  pPage->aDataEnd = &data[pBt->usableSize];
  pPage->aCellIdx = &data[first];
  pPage->aDataOfst = &data[pPage->childPtrSize];
  pPage->nOverflow = 0;
  assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
  pPage->maskPage = (u16)(pBt->pageSize - 1);
  pPage->nCell = 0;
  pPage->isInit = 1;
}